

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

bool __thiscall
IgnoreCaseStringLess::operator()(IgnoreCaseStringLess *this,string *a,string *b,locale *loc)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  bool bVar1;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]OpenXR_SDK_Source_src_tests_hello_xr_common_h:44:41)>
  __comp;
  
  __comp._M_comp.ctype = (anon_class_8_1_a7c3953d_for__M_comp)std::use_facet<std::ctype<char>>(loc);
  __first1._M_current = (a->_M_dataplus)._M_p;
  __first2._M_current = (b->_M_dataplus)._M_p;
  bVar1 = std::operator()(__first1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(__first1._M_current + a->_M_string_length),__first2,
                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )(__first2._M_current + b->_M_string_length),__comp);
  return bVar1;
}

Assistant:

bool operator()(const std::string& a, const std::string& b, const std::locale& loc = std::locale()) const noexcept {
        const std::ctype<char>& ctype = std::use_facet<std::ctype<char>>(loc);
        const auto ignoreCaseCharLess = [&](char c1, char c2) { return ctype.tolower(c1) < ctype.tolower(c2); };
        return std::lexicographical_compare(a.begin(), a.end(), b.begin(), b.end(), ignoreCaseCharLess);
    }